

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawSchema * __thiscall
capnp::SchemaLoader::Impl::loadEmpty
          (Impl *this,uint64_t id,StringPtr name,Which kind,bool isPlaceholder)

{
  RawSchema *pRVar1;
  ArrayPtr<capnp::word> firstSegment;
  Fault f;
  Builder node;
  MallocMessageBuilder builder;
  word scratch [32];
  
  memset(scratch,0,0x100);
  firstSegment.size_ = 0x20;
  firstSegment.ptr = scratch;
  MallocMessageBuilder::MallocMessageBuilder(&builder,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::schema::Node>(&node,&builder.super_MessageBuilder);
  *(uint64_t *)node._builder.data = id;
  capnp::schema::Node::Builder::setDisplayName(&node,(Reader)name.content);
  switch(kind) {
  case FILE:
  case CONST:
  case ANNOTATION:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x592,FAILED,(char *)0x0,"\"Not a type.\"",(char (*) [12])"Not a type.");
    kj::_::Debug::Fault::fatal(&f);
  case STRUCT:
    capnp::schema::Node::Builder::initStruct((Builder *)&f,&node);
    break;
  case ENUM:
    capnp::schema::Node::Builder::initEnum((Builder *)&f,&node);
    break;
  case INTERFACE:
    capnp::schema::Node::Builder::initInterface((Builder *)&f,&node);
  }
  capnp::_::StructBuilder::asReader(&node._builder);
  pRVar1 = load(this,(Reader *)&f,isPlaceholder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return pRVar1;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadEmpty(
    uint64_t id, kj::StringPtr name, schema::Node::Which kind, bool isPlaceholder) {
  word scratch[32];
  memset(scratch, 0, sizeof(scratch));
  MallocMessageBuilder builder(scratch);
  auto node = builder.initRoot<schema::Node>();
  node.setId(id);
  node.setDisplayName(name);
  switch (kind) {
    case schema::Node::STRUCT: node.initStruct(); break;
    case schema::Node::ENUM: node.initEnum(); break;
    case schema::Node::INTERFACE: node.initInterface(); break;

    case schema::Node::FILE:
    case schema::Node::CONST:
    case schema::Node::ANNOTATION:
      KJ_FAIL_REQUIRE("Not a type.");
      break;
  }

  return load(node, isPlaceholder);
}